

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O1

bool isbinary(io_buf *i)

{
  ssize_t sVar1;
  bool bVar2;
  
  if (((i->space)._end == i->head) &&
     (sVar1 = io_buf::fill(i,(i->files)._begin[i->current]), sVar1 < 1)) {
    return false;
  }
  bVar2 = *i->head == '\0';
  if (bVar2) {
    i->head = i->head + 1;
  }
  return bVar2;
}

Assistant:

bool isbinary(io_buf& i)
{
  if (i.space.end() == i.head)
    if (i.fill(i.files[i.current]) <= 0)
      return false;

  bool ret = (*i.head == 0);
  if (ret)
    i.head++;

  return ret;
}